

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxShortLeave(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *sel,int leave,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *maxabs)

{
  undefined8 uVar1;
  type_conflict5 tVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  ulong uVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  shortval;
  cpp_dec_float<50U,_int,_void> local_e8;
  undefined1 local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  uint local_98 [3];
  undefined3 uStack_8b;
  uint local_88;
  undefined3 uStack_83;
  int local_80;
  bool local_7c;
  undefined8 local_78;
  cpp_dec_float<50U,_int,_void> local_68;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_a8,
             &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar5 = -(ulong)(*(Real *)((long)local_a8 + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_68,
             (double)(~uVar5 & (ulong)(*(Real *)((long)local_a8 + 0x40) * 1e-05) |
                     uVar5 & 0x3ee4f8b588e368f1),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a0);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_a8,
               &((this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->theFvec->thedelta,leave);
  *(ulong *)((sel->m_backend).data._M_elems + 8) = CONCAT35(uStack_83,_local_88);
  *(undefined8 *)((sel->m_backend).data._M_elems + 4) = local_98._0_8_;
  *(ulong *)((sel->m_backend).data._M_elems + 6) = CONCAT35(uStack_8b,stack0xffffffffffffff70);
  *(undefined1 (*) [8])(sel->m_backend).data._M_elems = local_a8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((sel->m_backend).data._M_elems + 2) =
       _Stack_a0._M_pi;
  (sel->m_backend).exp = local_80;
  (sel->m_backend).neg = local_7c;
  (sel->m_backend).fpclass = (fpclass_type)local_78;
  (sel->m_backend).prec_elem = local_78._4_4_;
  local_78._0_4_ = cpp_dec_float_finite;
  local_78._4_4_ = 10;
  local_a8 = (undefined1  [8])0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98[0] = 0;
  local_98[1] = 0;
  stack0xffffffffffffff70 = 0;
  uStack_8b = 0;
  _local_88 = 0;
  uStack_83 = 0;
  local_80 = 0;
  local_7c = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)local_a8,&maxabs->m_backend,&local_68);
  tVar2 = boost::multiprecision::operator>
                    (sel,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_a8);
  if (tVar2) {
    pSVar3 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar4 = (pSVar3->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    uVar1 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 8);
    local_e8.data._M_elems._32_5_ = SUB85(uVar1,0);
    local_e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar1 >> 0x28);
    local_e8.data._M_elems._0_8_ = *(undefined8 *)(maxabs->m_backend).data._M_elems;
    local_e8.data._M_elems._8_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 2);
    local_e8.data._M_elems._16_8_ = *(undefined8 *)((maxabs->m_backend).data._M_elems + 4);
    uVar1 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 6);
    local_e8.data._M_elems._24_5_ = SUB85(uVar1,0);
    local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar1 >> 0x28);
    local_e8.exp = (maxabs->m_backend).exp;
    local_e8.neg = (maxabs->m_backend).neg;
    local_e8.fpclass = (maxabs->m_backend).fpclass;
    local_e8.prec_elem = (maxabs->m_backend).prec_elem;
    if (local_e8.fpclass != cpp_dec_float_finite || local_e8.data._M_elems[0] != 0) {
      local_e8.neg = (bool)(local_e8.neg ^ 1);
    }
    local_78._0_4_ = cpp_dec_float_finite;
    local_78._4_4_ = 10;
    local_a8 = (undefined1  [8])0x0;
    _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98[0] = 0;
    local_98[1] = 0;
    stack0xffffffffffffff70 = 0;
    uStack_8b = 0;
    _local_88 = 0;
    uStack_83 = 0;
    local_80 = 0;
    local_7c = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)local_a8,&local_e8,&local_68);
    tVar2 = boost::multiprecision::operator<
                      (sel,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_a8);
    if (!tVar2) {
      return false;
    }
    pSVar3 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar4 = (pSVar3->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  local_e8.fpclass = cpp_dec_float_finite;
  local_e8.prec_elem = 10;
  local_e8.data._M_elems[0] = 0;
  local_e8.data._M_elems[1] = 0;
  local_e8.data._M_elems[2] = 0;
  local_e8.data._M_elems[3] = 0;
  local_e8.data._M_elems[4] = 0;
  local_e8.data._M_elems[5] = 0;
  local_e8.data._M_elems._24_5_ = 0;
  local_e8.data._M_elems[7]._1_3_ = 0;
  local_e8.data._M_elems._32_5_ = 0;
  local_e8.data._M_elems[9]._1_3_ = 0;
  local_e8.exp = 0;
  local_e8.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_e8,&pnVar4[leave].m_backend,
             &(pSVar3->theFvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[leave].m_backend);
  local_78._0_4_ = cpp_dec_float_finite;
  local_78._4_4_ = 10;
  local_a8 = (undefined1  [8])0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98[0] = 0;
  local_98[1] = 0;
  stack0xffffffffffffff70 = 0;
  uStack_8b = 0;
  _local_88 = 0;
  uStack_83 = 0;
  local_80 = 0;
  local_7c = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)local_a8,&local_e8,&sel->m_backend);
  *(ulong *)((sel->m_backend).data._M_elems + 8) = CONCAT35(uStack_83,_local_88);
  *(undefined8 *)((sel->m_backend).data._M_elems + 4) = local_98._0_8_;
  *(ulong *)((sel->m_backend).data._M_elems + 6) = CONCAT35(uStack_8b,stack0xffffffffffffff70);
  *(undefined1 (*) [8])(sel->m_backend).data._M_elems = local_a8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((sel->m_backend).data._M_elems + 2) =
       _Stack_a0._M_pi;
  (sel->m_backend).exp = local_80;
  (sel->m_backend).neg = local_7c;
  (sel->m_backend).fpclass = (fpclass_type)local_78;
  (sel->m_backend).prec_elem = local_78._4_4_;
  return true;
}

Assistant:

bool SPxFastRT<R>::maxShortLeave(R& sel, int leave, R maxabs)
{
   assert(leave >= 0);
   assert(maxabs >= 0);

   R shortval = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_SHORTVAL);

   sel = this->thesolver->fVec().delta()[leave];

   if(sel > maxabs * shortval)
   {
      sel = (this->thesolver->ubBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   if(sel < -maxabs * shortval)
   {
      sel = (this->thesolver->lbBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   return false;
}